

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_change_cipher_spec(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  
  iVar4 = 0;
  if (((tls->field_0x160 & 4) != 0) && (iVar4 = ptls_buffer_reserve(sendbuf,3), iVar4 == 0)) {
    puVar2 = sendbuf->base;
    sVar3 = sendbuf->off;
    puVar1 = puVar2 + sVar3;
    puVar1[0] = '\x14';
    puVar1[1] = '\x03';
    puVar2[sVar3 + 2] = '\x03';
    sendbuf->off = sendbuf->off + 3;
    iVar4 = ptls_buffer_reserve(sendbuf,2);
    if (iVar4 == 0) {
      puVar1 = sendbuf->base;
      sVar3 = sendbuf->off;
      (puVar1 + sVar3)[0] = '\0';
      (puVar1 + sVar3)[1] = '\0';
      sVar3 = sendbuf->off;
      sendbuf->off = sVar3 + 2;
      iVar4 = ptls_buffer_reserve(sendbuf,1);
      if (iVar4 == 0) {
        sendbuf->base[sendbuf->off] = '\x01';
        sVar5 = sendbuf->off + 1;
        sendbuf->off = sVar5;
        lVar6 = sVar5 - (sVar3 + 2);
        sendbuf->base[sVar3] = (uint8_t)((ulong)lVar6 >> 8);
        sendbuf->base[sVar3 + 1] = (uint8_t)lVar6;
        tls->field_0x160 = tls->field_0x160 & 0xfb;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int push_change_cipher_spec(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret = 0;

    if (!tls->send_change_cipher_spec)
        goto Exit;
    buffer_push_record(sendbuf, PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC, { ptls_buffer_push(sendbuf, 1); });
    tls->send_change_cipher_spec = 0;
Exit:
    return ret;
}